

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode ServerNetworkLayerTCP_start(UA_ServerNetworkLayer *nl,UA_Logger logger)

{
  void *pvVar1;
  int iVar2;
  UA_StatusCode UVar3;
  undefined1 *local_258;
  undefined1 local_250 [8];
  sockaddr_in serv_addr;
  int optval;
  int newsock;
  char discoveryUrl [256];
  char hostname [256];
  UA_String du;
  ServerNetworkLayerTCP *layer;
  UA_Logger logger_local;
  UA_ServerNetworkLayer *nl_local;
  
  pvVar1 = nl->handle;
  *(UA_Logger *)((long)pvVar1 + 0x18) = logger;
  hostname[0xf8] = '\0';
  hostname[0xf9] = '\0';
  hostname[0xfa] = '\0';
  hostname[0xfb] = '\0';
  hostname[0xfc] = '\0';
  hostname[0xfd] = '\0';
  hostname[0xfe] = '\0';
  hostname[0xff] = '\0';
  iVar2 = gethostname(discoveryUrl + 0xf8,0xff);
  if (iVar2 == 0) {
    iVar2 = snprintf((char *)&optval,0xff,"opc.tcp://%s:%d",discoveryUrl + 0xf8,
                     (ulong)*(ushort *)((long)pvVar1 + 0x14));
    hostname._248_8_ = SEXT48(iVar2);
  }
  UA_String_copy((UA_String *)(hostname + 0xf8),&nl->discoveryUrl);
  serv_addr.sin_zero._4_4_ = socket(2,1,0);
  if ((int)serv_addr.sin_zero._4_4_ < 0) {
    UA_LOG_WARNING(*(UA_Logger *)((long)pvVar1 + 0x18),UA_LOGCATEGORY_NETWORK,
                   "Error opening the server socket");
  }
  else {
    serv_addr.sin_zero[0] = '\x01';
    serv_addr.sin_zero[1] = '\0';
    serv_addr.sin_zero[2] = '\0';
    serv_addr.sin_zero[3] = '\0';
    iVar2 = setsockopt(serv_addr.sin_zero._4_4_,1,2,serv_addr.sin_zero,4);
    if ((iVar2 != -1) && (UVar3 = socket_set_nonblocking(serv_addr.sin_zero._4_4_), UVar3 == 0)) {
      local_250._0_2_ = 2;
      local_250._2_2_ = htons(*(uint16_t *)((long)pvVar1 + 0x14));
      local_250[4] = '\0';
      local_250[5] = '\0';
      local_250[6] = '\0';
      local_250[7] = '\0';
      serv_addr.sin_family._0_1_ = 0;
      local_258 = (undefined1 *)((long)&serv_addr.sin_family + 1);
      do {
        *local_258 = 0;
        local_258 = local_258 + 1;
      } while (local_258 != serv_addr.sin_zero);
      iVar2 = bind(serv_addr.sin_zero._4_4_,(sockaddr *)local_250,0x10);
      if (iVar2 < 0) {
        UA_LOG_WARNING(*(UA_Logger *)((long)pvVar1 + 0x18),UA_LOGCATEGORY_NETWORK,
                       "Error during binding of the server socket");
        close(serv_addr.sin_zero._4_4_);
        return 0x80020000;
      }
      iVar2 = listen(serv_addr.sin_zero._4_4_,100);
      if (iVar2 < 0) {
        UA_LOG_WARNING(*(UA_Logger *)((long)pvVar1 + 0x18),UA_LOGCATEGORY_NETWORK,
                       "Error listening on server socket");
        close(serv_addr.sin_zero._4_4_);
        return 0x80020000;
      }
      *(undefined4 *)((long)pvVar1 + 0x20) = serv_addr.sin_zero._4_4_;
      UA_LOG_INFO(*(UA_Logger *)((long)pvVar1 + 0x18),UA_LOGCATEGORY_NETWORK,
                  "TCP network layer listening on %.*s",(nl->discoveryUrl).length,
                  (nl->discoveryUrl).data);
      return 0;
    }
    UA_LOG_WARNING(*(UA_Logger *)((long)pvVar1 + 0x18),UA_LOGCATEGORY_NETWORK,
                   "Error during setting of server socket options");
    close(serv_addr.sin_zero._4_4_);
  }
  return 0x80020000;
}

Assistant:

static UA_StatusCode
ServerNetworkLayerTCP_start(UA_ServerNetworkLayer *nl, UA_Logger logger) {
    ServerNetworkLayerTCP *layer = nl->handle;
    layer->logger = logger;

    /* get the discovery url from the hostname */
    UA_String du = UA_STRING_NULL;
    char hostname[256];
    if(gethostname(hostname, 255) == 0) {
        char discoveryUrl[256];
#ifndef _MSC_VER
        du.length = (size_t)snprintf(discoveryUrl, 255, "opc.tcp://%s:%d",
                                     hostname, layer->port);
#else
        du.length = (size_t)_snprintf_s(discoveryUrl, 255, _TRUNCATE,
                                        "opc.tcp://%s:%d", hostname, layer->port);
#endif
        du.data = (UA_Byte*)discoveryUrl;
    }
    UA_String_copy(&du, &nl->discoveryUrl);

    /* Create the server socket */
    SOCKET newsock = socket(PF_INET, SOCK_STREAM, 0);
#ifdef _WIN32
    if(newsock == INVALID_SOCKET)
#else
    if(newsock < 0)
#endif
    {
        UA_LOG_WARNING(layer->logger, UA_LOGCATEGORY_NETWORK,
                       "Error opening the server socket");
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Set socket options */
    int optval = 1;
    if(setsockopt(newsock, SOL_SOCKET, SO_REUSEADDR,
                  (const char *)&optval, sizeof(optval)) == -1 ||
       socket_set_nonblocking(newsock) != UA_STATUSCODE_GOOD) {
        UA_LOG_WARNING(layer->logger, UA_LOGCATEGORY_NETWORK,
                       "Error during setting of server socket options");
        CLOSESOCKET(newsock);
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Bind socket to address */
    const struct sockaddr_in serv_addr = {
        .sin_family = AF_INET, .sin_addr.s_addr = INADDR_ANY,
        .sin_port = htons(layer->port), .sin_zero = {0}};
    if(bind(newsock, (const struct sockaddr *)&serv_addr, sizeof(serv_addr)) < 0) {
        UA_LOG_WARNING(layer->logger, UA_LOGCATEGORY_NETWORK,
                       "Error during binding of the server socket");
        CLOSESOCKET(newsock);
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Start listening */
    if(listen(newsock, MAXBACKLOG) < 0) {
        UA_LOG_WARNING(layer->logger, UA_LOGCATEGORY_NETWORK,
                       "Error listening on server socket");
        CLOSESOCKET(newsock);
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    layer->serversockfd = (UA_Int32)newsock; /* cast on win32 */
    UA_LOG_INFO(layer->logger, UA_LOGCATEGORY_NETWORK,
                "TCP network layer listening on %.*s",
                nl->discoveryUrl.length, nl->discoveryUrl.data);
    return UA_STATUSCODE_GOOD;
}